

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

ON_String * __thiscall ON_String::operator=(ON_String *this,ON_String *src)

{
  ON_aStringHeader *hdr;
  ON_Internal_Empty_aString *pOVar1;
  char *pcVar2;
  
  pcVar2 = src->m_s;
  if (this->m_s != pcVar2) {
    if ((pcVar2 == (char *)0x0) ||
       (pOVar1 = (ON_Internal_Empty_aString *)(pcVar2 + -0xc), pOVar1 == &empty_astring)) {
      Destroy(this);
      pcVar2 = &empty_astring.s;
    }
    else {
      LOCK();
      (pOVar1->header).ref_count.super___atomic_base<int>._M_i =
           (pOVar1->header).ref_count.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      Destroy(this);
      pcVar2 = src->m_s;
    }
    this->m_s = pcVar2;
  }
  return this;
}

Assistant:

ON_String& ON_String::operator=(const ON_String& src)
{
	if (m_s != src.m_s)	
  {
    if ( nullptr != src.IncrementedHeader() )
    {
      Destroy();
      m_s = src.m_s;
    }
    else
    {
      Destroy();
      Create();
    }
  }
	return *this;
}